

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestHarness_cTest.cpp
# Opt level: O3

void __thiscall
TEST_TestHarness_c_checkBitsText_Test::~TEST_TestHarness_c_checkBitsText_Test
          (TEST_TestHarness_c_checkBitsText_Test *this)

{
  Utest::~Utest((Utest *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(TestHarness_c, checkBitsText)
{
    CHECK_EQUAL_C_BITS_TEXT(0xABCD, (unsigned short)0xABCD, 0xFFFF, "Text");
    fixture->setTestFunction(failBitsTextMethod_);
    fixture->runAllTests();
    fixture->assertPrintContains("expected <00000000 00000001>\n\tbut was  <00000000 00000011>");
    fixture->assertPrintContains("arness_c");
    fixture->assertPrintContains("Message: BitsTestText");
    CHECK(!hasDestructorOfTheDestructorCheckedBeenCalled);
}